

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_fchang_2003.h
# Opt level: O2

void __thiscall CT::PerformLabelingWithSteps(CT *this)

{
  PerformanceEvaluator *this_00;
  double dVar1;
  string local_38;
  
  dVar1 = Alloc(this);
  this_00 = &(this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_;
  PerformanceEvaluator::start(this_00);
  AllScans(this);
  PerformanceEvaluator::stop(this_00);
  Step_abi_cxx11_(&local_38,ALL_SCANS);
  PerformanceEvaluator::store
            (this_00,&local_38,
             ((this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last
             * 1000.0) /
             (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.tick_frequency_
            );
  std::__cxx11::string::~string((string *)&local_38);
  PerformanceEvaluator::start(this_00);
  PerformanceEvaluator::stop(this_00);
  Step_abi_cxx11_(&local_38,ALLOC_DEALLOC);
  PerformanceEvaluator::store
            (this_00,&local_38,
             dVar1 + ((this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.
                      counter_.last * 1000.0) /
                     (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.
                     tick_frequency_);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void PerformLabelingWithSteps()
    {
        double alloc_timing = Alloc();

        perf_.start();
        AllScans();
        perf_.stop();
        perf_.store(Step(StepType::ALL_SCANS), perf_.last());

        perf_.start();
        Dealloc();
        perf_.stop();
        perf_.store(Step(StepType::ALLOC_DEALLOC), perf_.last() + alloc_timing);
    }